

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

void nifti_datatype_sizes(int datatype,int *nbyper,int *swapsize)

{
  int local_28;
  int local_24;
  int ss;
  int nb;
  int *swapsize_local;
  int *nbyper_local;
  int datatype_local;
  
  local_24 = 0;
  local_28 = 0;
  if (datatype == 2) {
LAB_00107ea3:
    local_24 = 1;
    local_28 = 0;
  }
  else {
    if (datatype == 4) {
LAB_00107eb6:
      local_24 = 2;
      local_28 = 2;
      goto LAB_00107f44;
    }
    if ((datatype == 8) || (datatype == 0x10)) {
LAB_00107ee6:
      local_24 = 4;
      local_28 = 4;
      goto LAB_00107f44;
    }
    if (datatype == 0x20) {
      local_24 = 8;
      local_28 = 4;
      goto LAB_00107f44;
    }
    if (datatype != 0x40) {
      if (datatype == 0x80) {
        local_24 = 3;
        local_28 = 0;
        goto LAB_00107f44;
      }
      if (datatype == 0x100) goto LAB_00107ea3;
      if (datatype == 0x200) goto LAB_00107eb6;
      if (datatype == 0x300) goto LAB_00107ee6;
      if ((datatype != 0x400) && (datatype != 0x500)) {
        if (datatype == 0x600) {
          local_24 = 0x10;
          local_28 = 0x10;
        }
        else if (datatype == 0x700) {
          local_24 = 0x10;
          local_28 = 8;
        }
        else if (datatype == 0x800) {
          local_24 = 0x20;
          local_28 = 0x10;
        }
        else if (datatype == 0x900) {
          local_24 = 4;
          local_28 = 0;
        }
        goto LAB_00107f44;
      }
    }
    local_24 = 8;
    local_28 = 8;
  }
LAB_00107f44:
  if (nbyper != (int *)0x0) {
    *nbyper = local_24;
  }
  if (swapsize != (int *)0x0) {
    *swapsize = local_28;
  }
  return;
}

Assistant:

void nifti_datatype_sizes( int datatype , int *nbyper, int *swapsize )
{
   int nb=0, ss=0 ;
   switch( datatype ){
     case DT_INT8:
     case DT_UINT8:       nb =  1 ; ss =  0 ; break ;

     case DT_INT16:
     case DT_UINT16:      nb =  2 ; ss =  2 ; break ;

     case DT_RGB24:       nb =  3 ; ss =  0 ; break ;
     case DT_RGBA32:      nb =  4 ; ss =  0 ; break ;

     case DT_INT32:
     case DT_UINT32:
     case DT_FLOAT32:     nb =  4 ; ss =  4 ; break ;

     case DT_COMPLEX64:   nb =  8 ; ss =  4 ; break ;

     case DT_FLOAT64:
     case DT_INT64:
     case DT_UINT64:      nb =  8 ; ss =  8 ; break ;

     case DT_FLOAT128:    nb = 16 ; ss = 16 ; break ;

     case DT_COMPLEX128:  nb = 16 ; ss =  8 ; break ;

     case DT_COMPLEX256:  nb = 32 ; ss = 16 ; break ;
   }

   ASSIF(nbyper,nb) ; ASSIF(swapsize,ss) ; return ;
}